

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O0

ESPSResult
swrenderer::R_SetPatchStyle(FRenderStyle style,fixed_t alpha,int translation,uint32_t color)

{
  bool bVar1;
  fixed_t fglevel_00;
  fixed_t bglevel_00;
  int iVar2;
  int iVar3;
  FRemapTable *pFVar4;
  float fVar5;
  byte local_45;
  uint local_40;
  uint32_t alpha_1;
  uint32_t b;
  uint32_t g;
  uint32_t r;
  uint32_t x;
  FRemapTable *table;
  fixed_t bglevel;
  fixed_t fglevel;
  uint32_t color_local;
  int translation_local;
  fixed_t alpha_local;
  FRenderStyle style_local;
  
  translation_local = (int)style;
  FRenderStyle::CheckFuzz((FRenderStyle *)&translation_local);
  bglevel = color;
  color_local = alpha;
  if ((char)translation_local == '\b') {
    translation_local = LegacyRenderStyles[9].AsDWORD;
    color_local = 0x5555;
    bglevel = 0;
  }
  if ((translation_local & 0x1000000U) == 0) {
    if ((translation_local & 0x2000000U) == 0) {
      color_local = clamp<int>(color_local,0,0x10000);
    }
    else {
      color_local = 0x10000;
    }
  }
  else {
    fVar5 = FFloatCVar::operator_cast_to_float(&transsouls);
    color_local = (uint32_t)(fVar5 * 65536.0);
  }
  if ((((translation != -1) && (drawerargs::dc_translation = (BYTE *)0x0, translation != 0)) &&
      (pFVar4 = TranslationToTable(translation), pFVar4 != (FRemapTable *)0x0)) &&
     ((pFVar4->Inactive & 1U) == 0)) {
    drawerargs::dc_translation = pFVar4->Remap;
  }
  (anonymous_namespace)::basecolormapsave = basecolormap;
  hcolfunc_pre = R_DrawColumnHoriz;
  if ((char)translation_local == '\x04') {
    colfunc = fuzzcolfunc;
    alpha_local = 1;
  }
  else {
    bVar1 = FRenderStyle::operator==((FRenderStyle *)&translation_local,LegacyRenderStyles + 8);
    if (bVar1) {
      if ((int)color_local >> 0xc == 0) {
        alpha_local = 0;
      }
      else {
        colfunc = R_DrawShadedColumn;
        hcolfunc_post1 = rt_shaded1col;
        hcolfunc_post4 = rt_shaded4cols;
        if (fixedcolormap == 0) {
          local_45 = *(byte *)(*basecolormap + (ulong)((uint)bglevel >> 0x18));
        }
        else {
          local_45 = *(byte *)(fixedcolormap + (ulong)((uint)bglevel >> 0x18));
        }
        drawerargs::dc_color = (uint)local_45;
        basecolormap = (long *)(ShadeFakeColormap + (long)(0x10 - ((int)color_local >> 0xc)) * 0x20)
        ;
        drawerargs::dc_colormap = *basecolormap;
        if ((-1 < fixedlightlev) && (fixedcolormap == 0)) {
          drawerargs::dc_colormap = drawerargs::dc_colormap + fixedlightlev;
        }
        iVar2 = FIntCVar::operator_cast_to_int(&r_columnmethod);
        alpha_local = 1;
        if (iVar2 != 0) {
          alpha_local = 2;
        }
      }
    }
    else {
      fglevel_00 = anon_unknown_2::GetAlpha((uint)translation_local >> 8 & 0xff,color_local);
      bglevel_00 = anon_unknown_2::GetAlpha((uint)translation_local >> 0x10 & 0xff,color_local);
      if ((translation_local & 0x8000000U) != 0) {
        iVar2 = fglevel_00 >> 10;
        b = (uint)bglevel >> 0x10 & 0xff;
        alpha_1 = (uint)bglevel >> 8 & 0xff;
        local_40 = bglevel & 0xff;
        drawerargs::dc_color =
             (uint)RGB32k.All
                   [(ulong)(local_40 >> 3) + (ulong)(alpha_1 >> 3) * 0x20 + (ulong)(b >> 3) * 0x400]
        ;
        if ((translation_local & 0x10000000U) != 0) {
          b = 0xff - b;
          alpha_1 = 0xff - alpha_1;
          local_40 = 0xff - local_40;
        }
        iVar3 = clamp<int>(fglevel_00 >> 8,0,0xff);
        drawerargs::dc_srccolor_bgra = iVar3 << 0x18 | b << 0x10 | alpha_1 << 8 | local_40;
        drawerargs::dc_srccolor =
             ((b * iVar2 >> 4) << 0x14 | alpha_1 * iVar2 >> 4 | (local_40 * iVar2 >> 4) << 10) &
             0x3feffbff;
        hcolfunc_pre = R_FillColumnHoriz;
        R_SetColorMapLight(identitycolormap,0.0,0);
      }
      bVar1 = anon_unknown_2::R_SetBlendFunc
                        (translation_local & 0xff,fglevel_00,bglevel_00,
                         (uint)translation_local >> 0x18);
      if (bVar1) {
        iVar2 = FIntCVar::operator_cast_to_int(&r_columnmethod);
        alpha_local = 1;
        if (iVar2 != 0) {
          alpha_local = 2;
        }
      }
      else {
        alpha_local = 0;
      }
    }
  }
  return alpha_local;
}

Assistant:

ESPSResult R_SetPatchStyle(FRenderStyle style, fixed_t alpha, int translation, uint32_t color)
	{
		using namespace drawerargs;

		fixed_t fglevel, bglevel;

		style.CheckFuzz();

		if (style.BlendOp == STYLEOP_Shadow)
		{
			style = LegacyRenderStyles[STYLE_TranslucentStencil];
			alpha = TRANSLUC33;
			color = 0;
		}

		if (style.Flags & STYLEF_TransSoulsAlpha)
		{
			alpha = fixed_t(transsouls * OPAQUE);
		}
		else if (style.Flags & STYLEF_Alpha1)
		{
			alpha = FRACUNIT;
		}
		else
		{
			alpha = clamp<fixed_t>(alpha, 0, OPAQUE);
		}

		if (translation != -1)
		{
			dc_translation = NULL;
			if (translation != 0)
			{
				FRemapTable *table = TranslationToTable(translation);
				if (table != NULL && !table->Inactive)
				{
					dc_translation = table->Remap;
				}
			}
		}
		basecolormapsave = basecolormap;
		hcolfunc_pre = R_DrawColumnHoriz;

		// Check for special modes
		if (style.BlendOp == STYLEOP_Fuzz)
		{
			colfunc = fuzzcolfunc;
			return DoDraw0;
		}
		else if (style == LegacyRenderStyles[STYLE_Shaded])
		{
			// Shaded drawer only gets 16 levels of alpha because it saves memory.
			if ((alpha >>= 12) == 0)
				return DontDraw;
			colfunc = R_DrawShadedColumn;
			hcolfunc_post1 = rt_shaded1col;
			hcolfunc_post4 = rt_shaded4cols;
			dc_color = fixedcolormap ? fixedcolormap[APART(color)] : basecolormap->Maps[APART(color)];
			dc_colormap = (basecolormap = &ShadeFakeColormap[16 - alpha])->Maps;
			if (fixedlightlev >= 0 && fixedcolormap == NULL)
			{
				dc_colormap += fixedlightlev;
			}
			return r_columnmethod ? DoDraw1 : DoDraw0;
		}

		fglevel = GetAlpha(style.SrcAlpha, alpha);
		bglevel = GetAlpha(style.DestAlpha, alpha);

		if (style.Flags & STYLEF_ColorIsFixed)
		{
			uint32_t x = fglevel >> 10;
			uint32_t r = RPART(color);
			uint32_t g = GPART(color);
			uint32_t b = BPART(color);
			// dc_color is used by the rt_* routines. It is indexed into dc_srcblend.
			dc_color = RGB32k.RGB[r >> 3][g >> 3][b >> 3];
			if (style.Flags & STYLEF_InvertSource)
			{
				r = 255 - r;
				g = 255 - g;
				b = 255 - b;
			}
			uint32_t alpha = clamp(fglevel >> (FRACBITS - 8), 0, 255);
			dc_srccolor_bgra = (alpha << 24) | (r << 16) | (g << 8) | b;
			// dc_srccolor is used by the R_Fill* routines. It is premultiplied
			// with the alpha.
			dc_srccolor = ((((r*x) >> 4) << 20) | ((g*x) >> 4) | ((((b)*x) >> 4) << 10)) & 0x3feffbff;
			hcolfunc_pre = R_FillColumnHoriz;
			R_SetColorMapLight(identitycolormap.Maps, 0, 0);
		}

		if (!R_SetBlendFunc(style.BlendOp, fglevel, bglevel, style.Flags))
		{
			return DontDraw;
		}
		return r_columnmethod ? DoDraw1 : DoDraw0;
	}